

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cc
# Opt level: O0

void __thiscall hgdb::rtl::ExpressionPrinter::handle(ExpressionPrinter *this,IntegerLiteral *i)

{
  bool bVar1;
  int *piVar2;
  int local_5c;
  int value;
  _Optional_payload_base<int> local_30;
  optional<int> uint_opt;
  SVInt v;
  IntegerLiteral *i_local;
  ExpressionPrinter *this_local;
  
  slang::ast::IntegerLiteral::getValue((IntegerLiteral *)&uint_opt);
  local_30 = (_Optional_payload_base<int>)slang::SVInt::as<int,void>((SVInt *)&uint_opt);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_30);
  if (bVar1) {
    piVar2 = std::optional<int>::operator*((optional<int> *)&local_30);
    local_5c = *piVar2;
  }
  else {
    local_5c = 0;
  }
  std::ostream::operator<<(&this->field_0x18,local_5c);
  slang::SVInt::~SVInt((SVInt *)&uint_opt);
  return;
}

Assistant:

void handle(const slang::ast::IntegerLiteral &i) {
        auto v = i.getValue();
        auto uint_opt = v.as<int>();
        int value = uint_opt ? *uint_opt : 0;
        ss_ << value;
    }